

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

ssize_t __thiscall ListPanel::read(ListPanel *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint8_t *puVar4;
  int tmp;
  ScrollBarVisibility local_24;
  
  local_24 = (ScrollBarVisibility)((ulong)in_RAX >> 0x20);
  iVar1 = Util::readInt32((uint8_t *)CONCAT44(in_register_00000034,__fd),(int *)&local_24);
  puVar4 = (uint8_t *)CONCAT44(in_register_00000034,__fd) + iVar1;
  this->scrollBarVisibility = local_24;
  iVar1 = Util::readBool(puVar4,&this->showItemBorder);
  puVar4 = puVar4 + iVar1;
  iVar1 = Util::readBool(puVar4,&this->showSection);
  puVar4 = puVar4 + iVar1;
  iVar1 = Util::readBool(puVar4,&this->showEmptySection);
  iVar2 = Util::readString(puVar4 + iVar1,&this->listPanelItemName);
  sVar3 = Widget::read(&this->super_Widget,iVar2 + (int)(puVar4 + iVar1),__buf_00,__nbytes);
  return sVar3;
}

Assistant:

uint8_t* ListPanel::read(uint8_t *buf)
{
	int tmp;
	buf += Util::readInt32(buf, tmp);
	scrollBarVisibility = static_cast<ScrollBarVisibility>(tmp);
	buf += Util::readBool(buf, showItemBorder);
	buf += Util::readBool(buf, showSection);
	buf += Util::readBool(buf, showEmptySection);
	buf += Util::readString(buf, listPanelItemName);
	return Widget::read(buf);
}